

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

int __thiscall
trieste::NodeDef::clone(NodeDef *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  element_type *this_00;
  element_type *__fn_00;
  void *__child_stack_00;
  undefined1 local_80 [24];
  shared_ptr<trieste::NodeDef> *child;
  iterator __end2;
  iterator __begin2;
  Nodes *__range2;
  undefined1 local_19;
  pointer local_18;
  NodeDef *this_local;
  Node *node;
  
  local_19 = 0;
  local_18 = (pointer)__fn;
  this_local = this;
  Location::Location((Location *)&stack0xffffffffffffffc0,(Location *)(__fn + 0x18));
  create(this,(Token *)(__fn + 0x10),(Location *)&stack0xffffffffffffffc0);
  Location::~Location((Location *)&stack0xffffffffffffffc0);
  __end2 = std::
           vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
           ::begin((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    *)(__fn + 0x58));
  child = (shared_ptr<trieste::NodeDef> *)
          std::
          vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          ::end((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                 *)(__fn + 0x58));
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                           (&__end2,(__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                     *)&child), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_80._16_8_ =
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
         ::operator*(&__end2);
    this_00 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    __fn_00 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_80._16_8_);
    clone((NodeDef *)local_80,(__fn *)__fn_00,__child_stack_00,__flags,__arg);
    push_back(this_00,(Node *)local_80);
    std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_80);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
    ::operator++(&__end2);
  }
  return (int)this;
}

Assistant:

Node clone()
    {
      // This doesn't preserve the symbol table.
      auto node = create(type_, location_);

      for (auto& child : children)
        node->push_back(child->clone());

      return node;
    }